

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void pybind11::class_<ImGuiIO,_leaked_ptr<ImGuiIO>_>::dealloc(value_and_holder *v_h)

{
  byte bVar1;
  instance *piVar2;
  uint8_t *puVar3;
  ulong uVar4;
  align_val_t aVar5;
  error_scope scope;
  error_scope local_20;
  
  PyErr_Fetch(&local_20,&local_20.value,&local_20.trace);
  piVar2 = v_h->inst;
  bVar1 = piVar2->field_0x30;
  if ((bVar1 & 2) == 0) {
    puVar3 = (piVar2->field_1).nonsimple.status;
    bVar1 = puVar3[v_h->index];
    if ((bVar1 & 1) != 0) {
      puVar3[v_h->index] = bVar1 & 0xfe;
      goto LAB_002369af;
    }
  }
  else if ((bVar1 & 4) != 0) {
    piVar2->field_0x30 = bVar1 & 0xfb;
    goto LAB_002369af;
  }
  uVar4 = v_h->type->type_size;
  aVar5 = v_h->type->type_align;
  if (aVar5 < 0x11) {
    operator_delete(*v_h->vh,uVar4);
  }
  else {
    operator_delete(*v_h->vh,uVar4,aVar5);
  }
LAB_002369af:
  *v_h->vh = (void *)0x0;
  error_scope::~error_scope(&local_20);
  return;
}

Assistant:

static void dealloc(detail::value_and_holder &v_h) {
        // We could be deallocating because we are cleaning up after a Python exception.
        // If so, the Python error indicator will be set. We need to clear that before
        // running the destructor, in case the destructor code calls more Python.
        // If we don't, the Python API will exit with an exception, and pybind11 will
        // throw error_already_set from the C++ destructor which is forbidden and triggers
        // std::terminate().
        error_scope scope;
        if (v_h.holder_constructed()) {
            v_h.holder<holder_type>().~holder_type();
            v_h.set_holder_constructed(false);
        }
        else {
            detail::call_operator_delete(v_h.value_ptr<type>(),
                v_h.type->type_size,
                v_h.type->type_align
            );
        }
        v_h.value_ptr() = nullptr;
    }